

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_2a1b1f::DescriptorImpl::ExpandHelper
          (DescriptorImpl *this,int pos,SigningProvider *arg,DescriptorCache *read_cache,
          vector<CScript,_std::allocator<CScript>_> *output_scripts,FlatSigningProvider *out,
          DescriptorCache *write_cache)

{
  pointer puVar1;
  PubkeyProvider *pPVar2;
  pointer puVar3;
  pointer pCVar4;
  pointer ppVar5;
  bool bVar6;
  int iVar7;
  pointer puVar8;
  pointer __args;
  unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
  *p;
  pointer puVar9;
  long in_FS_OFFSET;
  bool bVar10;
  vector<CPubKey,_std::allocator<CPubKey>_> pubkeys;
  vector<CScript,_std::allocator<CScript>_> subscripts;
  vector<std::pair<CPubKey,_KeyOriginInfo>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
  entries;
  vector<CScript,_std::allocator<CScript>_> outscripts;
  FlatSigningProvider subprovider;
  vector<CPubKey,_std::allocator<CPubKey>_> local_218;
  vector<CScript,_std::allocator<CScript>_> local_1f8;
  vector<std::pair<CPubKey,_KeyOriginInfo>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
  local_1d8;
  vector<CScript,_std::allocator<CScript>_> local_1b8;
  undefined1 local_198 [8];
  pointer pCStack_190;
  pointer local_188;
  uchar local_150 [4];
  pointer local_148;
  pointer puStack_140;
  pointer local_138;
  FlatSigningProvider local_130;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_1d8.
  super__Vector_base<std::pair<CPubKey,_KeyOriginInfo>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.
  super__Vector_base<std::pair<CPubKey,_KeyOriginInfo>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.
  super__Vector_base<std::pair<CPubKey,_KeyOriginInfo>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::pair<CPubKey,_KeyOriginInfo>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>::
  reserve(&local_1d8,
          (long)(this->m_pubkey_args).
                super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->m_pubkey_args).
                super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3);
  puVar9 = (this->m_pubkey_args).
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->m_pubkey_args).
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar9 != puVar1) {
    do {
      std::
      vector<std::pair<CPubKey,_KeyOriginInfo>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
      ::emplace_back<>(&local_1d8);
      pPVar2 = (puVar9->_M_t).
               super___uniq_ptr_impl<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
               ._M_t.
               super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
               .super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>._M_head_impl;
      iVar7 = (*pPVar2->_vptr_PubkeyProvider[2])
                        (pPVar2,(ulong)(uint)pos,arg,
                         local_1d8.
                         super__Vector_base<std::pair<CPubKey,_KeyOriginInfo>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish + -1,
                         &local_1d8.
                          super__Vector_base<std::pair<CPubKey,_KeyOriginInfo>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-1].second,read_cache,
                         write_cache);
      if ((char)iVar7 == '\0') {
        bVar10 = false;
        goto LAB_0016ae63;
      }
      puVar9 = puVar9 + 1;
    } while (puVar9 != puVar1);
  }
  local_1f8.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1f8.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1f8.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_130.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_130.scripts._M_t._M_impl.super__Rb_tree_header._M_header;
  local_130.super_SigningProvider._vptr_SigningProvider =
       (_func_int **)&PTR__FlatSigningProvider_003dd7e0;
  local_130.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_130.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_130.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_130.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_130.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  local_130.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_130.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_130.pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_130.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_130.origins._M_t._M_impl.super__Rb_tree_header._M_header;
  local_130.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_130.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_130.origins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_130.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_130.keys._M_t._M_impl.super__Rb_tree_header._M_header;
  local_130.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_130.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_130.keys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_130.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_130.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header;
  local_130.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_130.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_130.tr_trees._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  puVar8 = (this->m_subdescriptor_args).
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (this->m_subdescriptor_args).
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_130.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_130.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_130.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_130.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_130.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_130.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_130.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_130.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_130.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_130.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    bVar10 = puVar8 == puVar3;
    if (bVar10) {
      FlatSigningProvider::Merge(out,&local_130);
      local_218.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_218.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
      super__Vector_impl_data._M_finish = (CPubKey *)0x0;
      local_218.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (CPubKey *)0x0;
      std::vector<CPubKey,_std::allocator<CPubKey>_>::reserve
                (&local_218,
                 ((long)local_1d8.
                        super__Vector_base<std::pair<CPubKey,_KeyOriginInfo>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_1d8.
                        super__Vector_base<std::pair<CPubKey,_KeyOriginInfo>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5);
      ppVar5 = local_1d8.
               super__Vector_base<std::pair<CPubKey,_KeyOriginInfo>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_1d8.
          super__Vector_base<std::pair<CPubKey,_KeyOriginInfo>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_1d8.
          super__Vector_base<std::pair<CPubKey,_KeyOriginInfo>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        __args = local_1d8.
                 super__Vector_base<std::pair<CPubKey,_KeyOriginInfo>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          pCVar4 = local_218.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          if (local_218.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_218.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<CPubKey,std::allocator<CPubKey>>::_M_realloc_insert<CPubKey_const&>
                      ((vector<CPubKey,std::allocator<CPubKey>> *)&local_218,
                       (iterator)
                       local_218.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                       super__Vector_impl_data._M_finish,&__args->first);
          }
          else {
            memcpy(local_218.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                   super__Vector_impl_data._M_finish,__args,0x41);
            local_218.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
            super__Vector_impl_data._M_finish = pCVar4 + 1;
          }
          CPubKey::GetID((CKeyID *)&local_1b8,&__args->first);
          memmove((pair<CPubKey,_KeyOriginInfo> *)local_198,__args,0x41);
          local_150 = *&(__args->second).fingerprint;
          local_148 = (__args->second).path.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start;
          puStack_140 = (__args->second).path.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish;
          local_138 = (__args->second).path.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
          (__args->second).path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (__args->second).path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (__args->second).path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          _Rb_tree<CKeyID,std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>,std::_Select1st<std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>>>
          ::_M_emplace_unique<CKeyID,std::pair<CPubKey,KeyOriginInfo>>
                    ((_Rb_tree<CKeyID,std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>,std::_Select1st<std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>>>
                      *)&out->origins,(CKeyID *)&local_1b8,(pair<CPubKey,_KeyOriginInfo> *)local_198
                    );
          if (local_148 != (pointer)0x0) {
            operator_delete(local_148,(long)local_138 - (long)local_148);
          }
          __args = __args + 1;
        } while (__args != ppVar5);
      }
      (*(this->super_Descriptor)._vptr_Descriptor[0x11])
                (&local_1b8,this,&local_218,
                 local_1f8.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (long)local_1f8.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_1f8.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                       super__Vector_impl_data._M_start >> 5,out);
      local_198 = (undefined1  [8])
                  (output_scripts->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      pCStack_190 = (output_scripts->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
      local_188 = (output_scripts->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
      (output_scripts->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
      super__Vector_impl_data._M_start =
           local_1b8.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
           super__Vector_impl_data._M_start;
      (output_scripts->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
      super__Vector_impl_data._M_finish =
           local_1b8.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (output_scripts->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_1b8.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_1b8.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_1b8.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1b8.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<CScript,_std::allocator<CScript>_>::~vector
                ((vector<CScript,_std::allocator<CScript>_> *)local_198);
      std::vector<CScript,_std::allocator<CScript>_>::~vector(&local_1b8);
      if (local_218.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_218.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_218.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_218.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
LAB_0016ae14:
      std::
      _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
      ::~_Rb_tree(&local_130.tr_trees._M_t);
      std::
      _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
      ::~_Rb_tree(&local_130.keys._M_t);
      std::
      _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
      ::~_Rb_tree(&local_130.origins._M_t);
      std::
      _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
      ::~_Rb_tree(&local_130.pubkeys._M_t);
      std::
      _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
      ::~_Rb_tree(&local_130.scripts._M_t);
      std::vector<CScript,_std::allocator<CScript>_>::~vector(&local_1f8);
LAB_0016ae63:
      std::
      vector<std::pair<CPubKey,_KeyOriginInfo>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
      ::~vector(&local_1d8);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return bVar10;
      }
      __stack_chk_fail();
    }
    local_198 = (undefined1  [8])0x0;
    pCStack_190 = (pointer)0x0;
    local_188 = (pointer)0x0;
    bVar6 = ExpandHelper((puVar8->_M_t).
                         super___uniq_ptr_impl<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_(anonymous_namespace)::DescriptorImpl_*,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                         .super__Head_base<0UL,_(anonymous_namespace)::DescriptorImpl_*,_false>.
                         _M_head_impl,pos,arg,read_cache,
                         (vector<CScript,_std::allocator<CScript>_> *)local_198,&local_130,
                         write_cache);
    if (!bVar6) {
      std::vector<CScript,_std::allocator<CScript>_>::~vector
                ((vector<CScript,_std::allocator<CScript>_> *)local_198);
      goto LAB_0016ae14;
    }
    if ((long)pCStack_190 - (long)local_198 != 0x20) {
      __assert_fail("outscripts.size() == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/descriptor.cpp"
                    ,0x2d3,
                    "bool (anonymous namespace)::DescriptorImpl::ExpandHelper(int, const SigningProvider &, const DescriptorCache *, std::vector<CScript> &, FlatSigningProvider &, DescriptorCache *) const"
                   );
    }
    std::vector<CScript,_std::allocator<CScript>_>::emplace_back<CScript>
              (&local_1f8,(CScript *)local_198);
    std::vector<CScript,_std::allocator<CScript>_>::~vector
              ((vector<CScript,_std::allocator<CScript>_> *)local_198);
    if (!bVar6) goto LAB_0016ae14;
    puVar8 = puVar8 + 1;
  } while( true );
}

Assistant:

bool ExpandHelper(int pos, const SigningProvider& arg, const DescriptorCache* read_cache, std::vector<CScript>& output_scripts, FlatSigningProvider& out, DescriptorCache* write_cache) const
    {
        std::vector<std::pair<CPubKey, KeyOriginInfo>> entries;
        entries.reserve(m_pubkey_args.size());

        // Construct temporary data in `entries`, `subscripts`, and `subprovider` to avoid producing output in case of failure.
        for (const auto& p : m_pubkey_args) {
            entries.emplace_back();
            if (!p->GetPubKey(pos, arg, entries.back().first, entries.back().second, read_cache, write_cache)) return false;
        }
        std::vector<CScript> subscripts;
        FlatSigningProvider subprovider;
        for (const auto& subarg : m_subdescriptor_args) {
            std::vector<CScript> outscripts;
            if (!subarg->ExpandHelper(pos, arg, read_cache, outscripts, subprovider, write_cache)) return false;
            assert(outscripts.size() == 1);
            subscripts.emplace_back(std::move(outscripts[0]));
        }
        out.Merge(std::move(subprovider));

        std::vector<CPubKey> pubkeys;
        pubkeys.reserve(entries.size());
        for (auto& entry : entries) {
            pubkeys.push_back(entry.first);
            out.origins.emplace(entry.first.GetID(), std::make_pair<CPubKey, KeyOriginInfo>(CPubKey(entry.first), std::move(entry.second)));
        }

        output_scripts = MakeScripts(pubkeys, Span{subscripts}, out);
        return true;
    }